

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_bfins(m68k_info *info)

{
  long in_RDI;
  cs_m68k_op temp;
  cs_m68k *ext;
  undefined1 auStack_48 [32];
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  m68k_info *in_stack_ffffffffffffffe0;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x396511);
  }
  else {
    build_bitfield_ins(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                      );
    memcpy(auStack_48,(void *)(in_RDI + 0x30),0x38);
    memcpy((void *)(in_RDI + 0x30),(void *)(in_RDI + 0x68),0x38);
    memcpy((void *)(in_RDI + 0x68),auStack_48,0x38);
  }
  return;
}

Assistant:

static void d68020_bfins(m68k_info *info)
{
	cs_m68k* ext = &info->extension;
	cs_m68k_op temp;

	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_bitfield_ins(info, M68K_INS_BFINS, true);

	// a bit hacky but we need to flip the args on only this instruction

	temp = ext->operands[0];
	ext->operands[0] = ext->operands[1];
	ext->operands[1] = temp;
}